

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O3

int __thiscall NetQuantize::fuse_requantize(NetQuantize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **ppvVar1;
  size_type *psVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  Layer *pLVar5;
  pointer pMVar6;
  long *plVar7;
  undefined8 uVar8;
  _func_int **pp_Var9;
  void *pvVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  pointer ppLVar14;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong local_38;
  
  pvVar15 = (this->super_ModelWriter).layers;
  ppLVar14 = (pvVar15->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppLVar3 = (pvVar15->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar17 = (long)ppLVar3 - (long)ppLVar14;
  if (lVar17 != 0) {
    ppvVar1 = &(this->super_ModelWriter).layers;
    uVar18 = lVar17 >> 3;
    uVar20 = 0;
    do {
      iVar11 = std::__cxx11::string::compare
                         ((char *)&((*ppvVar1)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar20]->type);
      if ((iVar11 == 0) ||
         (iVar11 = std::__cxx11::string::compare
                             ((char *)&((*ppvVar1)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar20]->type),
         iVar11 == 0)) {
        uVar21 = uVar20 + 1;
        uVar19 = uVar21;
        if (uVar21 < uVar18) {
          iVar11 = *(((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start[uVar20]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar12 = std::__cxx11::string::compare
                               ((char *)&((*ppvVar1)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar19]->type);
            if ((((iVar12 == 0) ||
                 (iVar12 = std::__cxx11::string::compare
                                     ((char *)&((*ppvVar1)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar19]->
                                               type), iVar12 == 0)) &&
                (pLVar4 = ((*ppvVar1)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar19],
                piVar13 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar13 == 4)) && (*piVar13 == iVar11))
            goto LAB_00164921;
            uVar19 = uVar19 + 1;
            uVar20 = uVar21;
          } while (uVar19 < uVar18);
        }
        else {
LAB_00164921:
          uVar20 = uVar21;
          if (uVar19 != uVar18) {
            fuse_requantize();
            uVar20 = local_38;
          }
        }
      }
      else {
        uVar20 = uVar20 + 1;
      }
    } while (uVar20 != uVar18 + (uVar18 == 0));
    if (ppLVar3 != ppLVar14) {
      lVar17 = 0;
      do {
        iVar11 = std::__cxx11::string::compare
                           ((char *)&((*ppvVar1)->
                                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar17]->type);
        if ((iVar11 == 0) ||
           (iVar11 = std::__cxx11::string::compare
                               ((char *)&((*ppvVar1)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[lVar17]->type),
           iVar11 == 0)) {
          uVar20 = lVar17 + 1;
          lVar16 = lVar17;
          if (uVar20 < uVar18) {
            iVar11 = *(((*ppvVar1)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar17]->tops).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            do {
              iVar12 = std::__cxx11::string::compare
                                 ((char *)&((*ppvVar1)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar20]->type)
              ;
              if (((iVar12 == 0) &&
                  (pLVar4 = ((*ppvVar1)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[uVar20],
                  piVar13 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                  (long)*(pointer *)
                         ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) - (long)piVar13 == 4)) && (*piVar13 == iVar11)) {
                lVar16 = uVar20 - 1;
                goto LAB_00164a5a;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < uVar18);
          }
          else {
LAB_00164a5a:
            if (uVar20 != uVar18) {
              ppLVar14 = ((*ppvVar1)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start;
              pLVar4 = ppLVar14[uVar20];
              piVar13 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (*(pointer *)
                   ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                  != piVar13) {
                uVar20 = lVar16 + 2;
                uVar21 = 0;
                do {
                  uVar19 = uVar20;
                  if (uVar20 < uVar18) {
                    iVar11 = piVar13[uVar21];
                    while ((((iVar12 = std::__cxx11::string::compare
                                                 ((char *)&((*ppvVar1)->
                                                                                                                      
                                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar19]
                                                  ->type), iVar12 != 0 &&
                             (iVar12 = std::__cxx11::string::compare
                                                 ((char *)&((*ppvVar1)->
                                                                                                                      
                                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar19]
                                                  ->type), iVar12 != 0)) ||
                            (pLVar5 = ((*ppvVar1)->
                                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar19],
                            piVar13 = (pLVar5->bottoms).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start,
                            (long)*(pointer *)
                                   ((long)&(pLVar5->bottoms).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                                   ) - (long)piVar13 != 4)) || (*piVar13 != iVar11))) {
                      uVar19 = uVar19 + 1;
                      if (uVar18 == uVar19) goto LAB_00164ef8;
                    }
                  }
                  if (uVar19 == uVar18) goto LAB_00164ef8;
                  iVar11 = std::__cxx11::string::compare
                                     ((char *)&((*ppvVar1)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar19]->
                                               type);
                  pLVar5 = ((*ppvVar1)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar19];
                  if (((iVar11 == 0) &&
                      (*(long *)&pLVar5[1].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data != 1)) ||
                     ((iVar11 = std::__cxx11::string::compare((char *)&pLVar5->type), iVar11 == 0 &&
                      (*(pointer *)
                        ((long)&((*ppvVar1)->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_start[uVar19][1].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8) != (pointer)0x1)))) goto LAB_00164ef8;
                  uVar21 = uVar21 + 1;
                  piVar13 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                } while (uVar21 < (ulong)((long)*(pointer *)
                                                 ((long)&(pLVar4->tops).
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar13 >> 2));
                ppLVar14 = ((*ppvVar1)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start;
              }
              iVar11 = (((this->super_ModelWriter).blobs)->
                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                       super__Vector_impl_data._M_start[*piVar13].consumer;
              fprintf(_stderr,"fuse_requantize %s %s\n",(ppLVar14[lVar17]->name)._M_dataplus._M_p,
                      (pLVar4->name)._M_dataplus._M_p);
              iVar12 = std::__cxx11::string::compare
                                 ((char *)&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar17]->type)
              ;
              pvVar15 = (this->super_ModelWriter).layers;
              if (iVar12 == 0) {
                iVar12 = std::__cxx11::string::compare
                                   ((char *)&(pvVar15->
                                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[iVar11]->
                                             type);
                pvVar15 = *ppvVar1;
                if (iVar12 == 0) {
                  ppLVar14 = (pvVar15->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                  pLVar4 = ppLVar14[lVar17];
                  if ((*(long *)&pLVar4[1].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data != 1) ||
                     (pLVar5 = ppLVar14[iVar11],
                     *(long *)&pLVar5[1].bottom_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data != 1)) goto LAB_00164ef8;
                  psVar2 = &pLVar4[1].type._M_string_length;
                  *(int *)psVar2 = (int)*psVar2 + 100;
                  if ((pointer *)&pLVar4[3].support_tensor_storage !=
                      (pointer *)
                      ((long)&pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                      0x10U)) {
                    piVar13 = *(int **)&pLVar5[2].bottom_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data;
                    if (piVar13 != (int *)0x0) {
                      LOCK();
                      *piVar13 = *piVar13 + 1;
                      UNLOCK();
                    }
                    piVar13 = *(int **)&pLVar4[3].support_reserved_6;
                    if (piVar13 != (int *)0x0) {
                      LOCK();
                      *piVar13 = *piVar13 + -1;
                      UNLOCK();
                      if (*piVar13 == 0) {
                        plVar7 = (long *)pLVar4[3].type._M_dataplus._M_p;
                        if (plVar7 == (long *)0x0) {
                          if (*(void **)&pLVar4[3].support_tensor_storage != (void *)0x0) {
                            free(*(void **)&pLVar4[3].support_tensor_storage);
                          }
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                        }
                      }
                    }
                    pLVar4[3].name._M_dataplus._M_p = (pointer)0x0;
                    *(undefined8 *)&pLVar4[3].support_reserved_10 = 0;
                    *(undefined8 *)((long)&pLVar4[3].userdata + 4) = 0;
                    pLVar4[3].support_tensor_storage = false;
                    pLVar4[3].support_reserved_00 = false;
                    pLVar4[3].support_reserved_0 = false;
                    pLVar4[3].support_reserved_1 = false;
                    pLVar4[3].support_reserved_2 = false;
                    pLVar4[3].support_reserved_3 = false;
                    pLVar4[3].support_reserved_4 = false;
                    pLVar4[3].support_reserved_5 = false;
                    pLVar4[3].support_reserved_6 = false;
                    pLVar4[3].support_reserved_7 = false;
                    pLVar4[3].support_reserved_8 = false;
                    pLVar4[3].support_reserved_9 = false;
                    pLVar4[3].support_reserved_10 = false;
                    pLVar4[3].support_reserved_11 = false;
                    pLVar4[3].support_reserved_12 = false;
                    pLVar4[3].support_reserved_13 = false;
                    pLVar4[3].type._M_string_length = 0;
                    pLVar4[3].type.field_2._M_allocated_capacity = 0;
                    *(undefined4 *)((long)&pLVar4[3].type.field_2 + 8) = 0;
                    uVar8 = pLVar5[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                    *(pointer *)&pLVar4[3].support_tensor_storage =
                         *(pointer *)
                          ((long)&pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl + 0x10);
                    pLVar4[3].support_reserved_6 = (bool)(char)uVar8;
                    pLVar4[3].support_reserved_7 = (bool)(char)((ulong)uVar8 >> 8);
                    pLVar4[3].support_reserved_8 = (bool)(char)((ulong)uVar8 >> 0x10);
                    pLVar4[3].support_reserved_9 = (bool)(char)((ulong)uVar8 >> 0x18);
                    pLVar4[3].support_reserved_10 = (bool)(char)((ulong)uVar8 >> 0x20);
                    pLVar4[3].support_reserved_11 = (bool)(char)((ulong)uVar8 >> 0x28);
                    pLVar4[3].support_reserved_12 = (bool)(char)((ulong)uVar8 >> 0x30);
                    pLVar4[3].support_reserved_13 = (bool)(char)((ulong)uVar8 >> 0x38);
                    pLVar4[3].userdata =
                         *(pointer *)
                          ((long)&pLVar5[2].bottom_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 8);
                    pLVar4[3].typeindex =
                         *(int *)((long)&pLVar5[2].bottom_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl + 0x10);
                    pLVar4[3].type._M_dataplus._M_p =
                         *(pointer *)
                          &pLVar5[2].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data;
                    pMVar6 = *(pointer *)
                              ((long)&pLVar5[2].top_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl + 0x10);
                    pLVar4[3].type._M_string_length =
                         (size_type)
                         *(pointer *)
                          ((long)&pLVar5[2].top_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 8);
                    pLVar4[3].type.field_2._M_allocated_capacity = (size_type)pMVar6;
                    *(undefined4 *)((long)&pLVar4[3].type.field_2 + 8) =
                         *(undefined4 *)&pLVar5[3]._vptr_Layer;
                    pLVar4[3].name._M_dataplus._M_p = *(pointer *)&pLVar5[3].one_blob_only;
                    pvVar15 = *ppvVar1;
                  }
                }
              }
              iVar12 = std::__cxx11::string::compare
                                 ((char *)&(pvVar15->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar17]->type)
              ;
              pvVar15 = *ppvVar1;
              if (iVar12 == 0) {
                iVar12 = std::__cxx11::string::compare
                                   ((char *)&(pvVar15->
                                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[iVar11]->
                                             type);
                pvVar15 = *ppvVar1;
                if (iVar12 == 0) {
                  ppLVar14 = (pvVar15->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                  pLVar4 = ppLVar14[lVar17];
                  if ((*(long *)&pLVar4[1].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data != 1) ||
                     (pLVar5 = ppLVar14[iVar11],
                     *(pointer *)
                      ((long)&pLVar5[1].bottom_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8)
                     != (pointer)0x1)) goto LAB_00164ef8;
                  psVar2 = &pLVar4[1].type._M_string_length;
                  *(int *)psVar2 = (int)*psVar2 + 100;
                  if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      &pLVar4[3].support_tensor_storage != &pLVar5[2].bottom_shapes) {
                    pMVar6 = *(pointer *)
                              ((long)&pLVar5[2].bottom_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl + 8);
                    if (pMVar6 != (pointer)0x0) {
                      LOCK();
                      *(int *)&pMVar6->data = *(int *)&pMVar6->data + 1;
                      UNLOCK();
                    }
                    piVar13 = *(int **)&pLVar4[3].support_reserved_6;
                    if (piVar13 != (int *)0x0) {
                      LOCK();
                      *piVar13 = *piVar13 + -1;
                      UNLOCK();
                      if (*piVar13 == 0) {
                        plVar7 = (long *)pLVar4[3].type._M_dataplus._M_p;
                        if (plVar7 == (long *)0x0) {
                          if (*(void **)&pLVar4[3].support_tensor_storage != (void *)0x0) {
                            free(*(void **)&pLVar4[3].support_tensor_storage);
                          }
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                        }
                      }
                    }
                    pLVar4[3].name._M_dataplus._M_p = (pointer)0x0;
                    *(undefined8 *)&pLVar4[3].support_reserved_10 = 0;
                    *(undefined8 *)((long)&pLVar4[3].userdata + 4) = 0;
                    pLVar4[3].support_tensor_storage = false;
                    pLVar4[3].support_reserved_00 = false;
                    pLVar4[3].support_reserved_0 = false;
                    pLVar4[3].support_reserved_1 = false;
                    pLVar4[3].support_reserved_2 = false;
                    pLVar4[3].support_reserved_3 = false;
                    pLVar4[3].support_reserved_4 = false;
                    pLVar4[3].support_reserved_5 = false;
                    pLVar4[3].support_reserved_6 = false;
                    pLVar4[3].support_reserved_7 = false;
                    pLVar4[3].support_reserved_8 = false;
                    pLVar4[3].support_reserved_9 = false;
                    pLVar4[3].support_reserved_10 = false;
                    pLVar4[3].support_reserved_11 = false;
                    pLVar4[3].support_reserved_12 = false;
                    pLVar4[3].support_reserved_13 = false;
                    pLVar4[3].type._M_string_length = 0;
                    pLVar4[3].type.field_2._M_allocated_capacity = 0;
                    *(undefined4 *)((long)&pLVar4[3].type.field_2 + 8) = 0;
                    uVar8 = pLVar5[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                    pMVar6 = *(pointer *)
                              ((long)&pLVar5[2].bottom_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl + 8);
                    pLVar4[3].support_tensor_storage = (bool)(char)uVar8;
                    pLVar4[3].support_reserved_00 = (bool)(char)((ulong)uVar8 >> 8);
                    pLVar4[3].support_reserved_0 = (bool)(char)((ulong)uVar8 >> 0x10);
                    pLVar4[3].support_reserved_1 = (bool)(char)((ulong)uVar8 >> 0x18);
                    pLVar4[3].support_reserved_2 = (bool)(char)((ulong)uVar8 >> 0x20);
                    pLVar4[3].support_reserved_3 = (bool)(char)((ulong)uVar8 >> 0x28);
                    pLVar4[3].support_reserved_4 = (bool)(char)((ulong)uVar8 >> 0x30);
                    pLVar4[3].support_reserved_5 = (bool)(char)((ulong)uVar8 >> 0x38);
                    *(pointer *)&pLVar4[3].support_reserved_6 = pMVar6;
                    pLVar4[3].userdata =
                         *(pointer *)
                          ((long)&pLVar5[2].bottom_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 0x10);
                    pLVar4[3].typeindex =
                         *(int *)&pLVar5[2].top_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data;
                    pLVar4[3].type._M_dataplus._M_p =
                         (pointer)*(pointer *)
                                   ((long)&pLVar5[2].top_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl + 8);
                    pp_Var9 = pLVar5[3]._vptr_Layer;
                    pLVar4[3].type._M_string_length =
                         (size_type)
                         *(pointer *)
                          ((long)&pLVar5[2].top_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 0x10);
                    pLVar4[3].type.field_2._M_allocated_capacity = (size_type)pp_Var9;
                    *(undefined4 *)((long)&pLVar4[3].type.field_2 + 8) =
                         *(undefined4 *)&pLVar5[3].one_blob_only;
                    pLVar4[3].name._M_dataplus._M_p = *(pointer *)&pLVar5[3].support_tensor_storage;
                    pvVar15 = *ppvVar1;
                  }
                }
              }
              iVar12 = std::__cxx11::string::compare
                                 ((char *)&(pvVar15->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar17]->type)
              ;
              pvVar15 = *ppvVar1;
              if (iVar12 == 0) {
                iVar12 = std::__cxx11::string::compare
                                   ((char *)&(pvVar15->
                                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[iVar11]->
                                             type);
                pvVar15 = *ppvVar1;
                if (iVar12 == 0) {
                  ppLVar14 = (pvVar15->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                  pLVar4 = ppLVar14[lVar17];
                  if ((*(pointer *)
                        ((long)&pLVar4[1].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8) != (pointer)0x1) ||
                     (pLVar5 = ppLVar14[iVar11],
                     *(long *)&pLVar5[1].bottom_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data != 1)) goto LAB_00164ef8;
                  piVar13 = (int *)((long)&pLVar4[1].type._M_string_length + 4);
                  *piVar13 = *piVar13 + 100;
                  if ((pointer *)&pLVar4[3].support_reserved_6 !=
                      (pointer *)
                      ((long)&pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                      0x10U)) {
                    piVar13 = *(int **)&pLVar5[2].bottom_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data;
                    if (piVar13 != (int *)0x0) {
                      LOCK();
                      *piVar13 = *piVar13 + 1;
                      UNLOCK();
                    }
                    piVar13 = (int *)pLVar4[3].userdata;
                    if (piVar13 != (int *)0x0) {
                      LOCK();
                      *piVar13 = *piVar13 + -1;
                      UNLOCK();
                      if (*piVar13 == 0) {
                        plVar7 = (long *)pLVar4[3].type._M_string_length;
                        if (plVar7 == (long *)0x0) {
                          if (*(void **)&pLVar4[3].support_reserved_6 != (void *)0x0) {
                            free(*(void **)&pLVar4[3].support_reserved_6);
                          }
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                        }
                      }
                    }
                    pLVar4[3].name._M_string_length = 0;
                    *(undefined8 *)((long)&pLVar4[3].userdata + 4) = 0;
                    *(undefined8 *)&pLVar4[3].field_0x2c = 0;
                    pLVar4[3].support_reserved_6 = false;
                    pLVar4[3].support_reserved_7 = false;
                    pLVar4[3].support_reserved_8 = false;
                    pLVar4[3].support_reserved_9 = false;
                    pLVar4[3].support_reserved_10 = false;
                    pLVar4[3].support_reserved_11 = false;
                    pLVar4[3].support_reserved_12 = false;
                    pLVar4[3].support_reserved_13 = false;
                    pLVar4[3].userdata = (void *)0x0;
                    pLVar4[3].type.field_2._M_allocated_capacity = 0;
                    *(undefined8 *)((long)&pLVar4[3].type.field_2 + 8) = 0;
                    *(undefined4 *)&pLVar4[3].name._M_dataplus._M_p = 0;
                    pvVar10 = pLVar5[2].bottom_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    *(pointer *)&pLVar4[3].support_reserved_6 =
                         *(pointer *)
                          ((long)&pLVar5[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl + 0x10);
                    pLVar4[3].userdata = pvVar10;
                    *(pointer *)&pLVar4[3].typeindex =
                         *(pointer *)
                          ((long)&pLVar5[2].bottom_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 8);
                    *(undefined4 *)&pLVar4[3].type._M_dataplus._M_p =
                         *(undefined4 *)
                          ((long)&pLVar5[2].bottom_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 0x10);
                    pLVar4[3].type._M_string_length =
                         *(size_type *)
                          &pLVar5[2].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data;
                    pMVar6 = *(pointer *)
                              ((long)&pLVar5[2].top_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl + 0x10);
                    pLVar4[3].type.field_2._M_allocated_capacity =
                         (size_type)
                         *(pointer *)
                          ((long)&pLVar5[2].top_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 8);
                    *(pointer *)((long)&pLVar4[3].type.field_2 + 8) = pMVar6;
                    *(undefined4 *)&pLVar4[3].name._M_dataplus._M_p =
                         *(undefined4 *)&pLVar5[3]._vptr_Layer;
                    pLVar4[3].name._M_string_length = *(size_type *)&pLVar5[3].one_blob_only;
                    pvVar15 = *ppvVar1;
                  }
                }
              }
              iVar12 = std::__cxx11::string::compare
                                 ((char *)&(pvVar15->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar17]->type)
              ;
              if ((iVar12 == 0) &&
                 (iVar12 = std::__cxx11::string::compare
                                     ((char *)&((*ppvVar1)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[iVar11]->
                                               type), iVar12 == 0)) {
                ppLVar14 = ((*ppvVar1)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                pLVar4 = ppLVar14[lVar17];
                if ((*(pointer *)
                      ((long)&pLVar4[1].bottom_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8)
                     == (pointer)0x1) &&
                   (pLVar5 = ppLVar14[iVar11],
                   *(pointer *)
                    ((long)&pLVar5[1].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8)
                   == (pointer)0x1)) {
                  piVar13 = (int *)((long)&pLVar4[1].type._M_string_length + 4);
                  *piVar13 = *piVar13 + 100;
                  if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pLVar4[3].support_reserved_6
                      != &pLVar5[2].bottom_shapes) {
                    pMVar6 = *(pointer *)
                              ((long)&pLVar5[2].bottom_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl + 8);
                    if (pMVar6 != (pointer)0x0) {
                      LOCK();
                      *(int *)&pMVar6->data = *(int *)&pMVar6->data + 1;
                      UNLOCK();
                    }
                    piVar13 = (int *)pLVar4[3].userdata;
                    if (piVar13 != (int *)0x0) {
                      LOCK();
                      *piVar13 = *piVar13 + -1;
                      UNLOCK();
                      if (*piVar13 == 0) {
                        plVar7 = (long *)pLVar4[3].type._M_string_length;
                        if (plVar7 == (long *)0x0) {
                          if (*(void **)&pLVar4[3].support_reserved_6 != (void *)0x0) {
                            free(*(void **)&pLVar4[3].support_reserved_6);
                          }
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                        }
                      }
                    }
                    pLVar4[3].name._M_string_length = 0;
                    *(undefined8 *)((long)&pLVar4[3].userdata + 4) = 0;
                    *(undefined8 *)&pLVar4[3].field_0x2c = 0;
                    pLVar4[3].support_reserved_6 = false;
                    pLVar4[3].support_reserved_7 = false;
                    pLVar4[3].support_reserved_8 = false;
                    pLVar4[3].support_reserved_9 = false;
                    pLVar4[3].support_reserved_10 = false;
                    pLVar4[3].support_reserved_11 = false;
                    pLVar4[3].support_reserved_12 = false;
                    pLVar4[3].support_reserved_13 = false;
                    pLVar4[3].userdata = (void *)0x0;
                    pLVar4[3].type.field_2._M_allocated_capacity = 0;
                    *(undefined8 *)((long)&pLVar4[3].type.field_2 + 8) = 0;
                    *(undefined4 *)&pLVar4[3].name._M_dataplus._M_p = 0;
                    uVar8 = pLVar5[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                    pMVar6 = *(pointer *)
                              ((long)&pLVar5[2].bottom_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl + 8);
                    pLVar4[3].support_reserved_6 = (bool)(char)uVar8;
                    pLVar4[3].support_reserved_7 = (bool)(char)((ulong)uVar8 >> 8);
                    pLVar4[3].support_reserved_8 = (bool)(char)((ulong)uVar8 >> 0x10);
                    pLVar4[3].support_reserved_9 = (bool)(char)((ulong)uVar8 >> 0x18);
                    pLVar4[3].support_reserved_10 = (bool)(char)((ulong)uVar8 >> 0x20);
                    pLVar4[3].support_reserved_11 = (bool)(char)((ulong)uVar8 >> 0x28);
                    pLVar4[3].support_reserved_12 = (bool)(char)((ulong)uVar8 >> 0x30);
                    pLVar4[3].support_reserved_13 = (bool)(char)((ulong)uVar8 >> 0x38);
                    pLVar4[3].userdata = pMVar6;
                    *(pointer *)&pLVar4[3].typeindex =
                         *(pointer *)
                          ((long)&pLVar5[2].bottom_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 0x10);
                    *(undefined4 *)&pLVar4[3].type._M_dataplus._M_p =
                         *(undefined4 *)
                          &pLVar5[2].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data;
                    pLVar4[3].type._M_string_length =
                         (size_type)
                         *(pointer *)
                          ((long)&pLVar5[2].top_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 8);
                    pp_Var9 = pLVar5[3]._vptr_Layer;
                    pLVar4[3].type.field_2._M_allocated_capacity =
                         (size_type)
                         *(pointer *)
                          ((long)&pLVar5[2].top_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 0x10);
                    *(_func_int ***)((long)&pLVar4[3].type.field_2 + 8) = pp_Var9;
                    *(undefined4 *)&pLVar4[3].name._M_dataplus._M_p =
                         *(undefined4 *)&pLVar5[3].one_blob_only;
                    pLVar4[3].name._M_string_length =
                         *(size_type *)&pLVar5[3].support_tensor_storage;
                  }
                }
              }
            }
          }
        }
LAB_00164ef8:
        lVar17 = lVar17 + 1;
      } while (lVar17 != uVar18 + (uVar18 == 0));
    }
  }
  return 0;
}

Assistant:

int NetQuantize::fuse_requantize()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution" && layers[j]->type != "ConvolutionDepthWise")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), layers[j]->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Split - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Split")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Split* split = (ncnn::Split*)layers[j];

        bool all_conv = true;
        for (size_t p = 0; p < split->tops.size(); p++)
        {
            int split_top_blob_index = split->tops[p];

            size_t k = j + 1;
            for (; k < layer_count; k++)
            {
                if (layers[k]->type != "Convolution" && layers[k]->type != "ConvolutionDepthWise")
                    continue;

                if (layers[k]->bottoms.size() != 1)
                    continue;

                if (layers[k]->bottoms[0] == split_top_blob_index)
                    break;
            }

            if (k == layer_count)
            {
                all_conv = false;
                break;
            }

            if (layers[k]->type == "Convolution")
            {
                ncnn::Convolution* convolution = (ncnn::Convolution*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
            if (layers[k]->type == "ConvolutionDepthWise")
            {
                ncnn::ConvolutionDepthWise* convolution = (ncnn::ConvolutionDepthWise*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
        }

        if (!all_conv)
            continue;

        j = blobs[split->tops[0]].consumer;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), split->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    return 0;
}